

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

int __thiscall
MeCab::DecoderFeatureIndex::open(DecoderFeatureIndex *this,char *__file,int __oflag,...)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  die local_31;
  string modelfile;
  
  Param::get<std::__cxx11::string>(&modelfile,(Param *)__file,"model");
  bVar1 = openBinaryModel(this,(Param *)__file);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&modelfile);
    poVar2 = std::operator<<(poVar2," is not a binary model. reopen it as text mode...");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = openTextModel(this,(Param *)__file);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar2 = std::operator<<(poVar2,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7c);
      poVar2 = std::operator<<(poVar2,") [");
      poVar2 = std::operator<<(poVar2,"openTextModel(param)");
      poVar2 = std::operator<<(poVar2,"] ");
      poVar2 = std::operator<<(poVar2,"no such file or directory: ");
      std::operator<<(poVar2,(string *)&modelfile);
      die::~die(&local_31);
    }
  }
  FeatureIndex::openTemplate(&this->super_FeatureIndex,(Param *)__file);
  uVar3 = std::__cxx11::string::~string((string *)&modelfile);
  return (int)CONCAT71((int7)((ulong)uVar3 >> 8),1);
}

Assistant:

bool DecoderFeatureIndex::open(const Param &param) {
  const std::string modelfile = param.get<std::string>("model");
  // open the file as binary mode again and fallback to text file
  if (!openBinaryModel(param)) {
    std::cout << modelfile
              << " is not a binary model. reopen it as text mode..."
              << std::endl;
    CHECK_DIE(openTextModel(param)) <<
        "no such file or directory: " << modelfile;
  }

  if (!openTemplate(param)) {
    close();
    return false;
  }

  return true;
}